

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tuple.h
# Opt level: O2

tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL,_24UL,_25UL,_26UL>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<140U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
* __thiscall
meta::impl::
tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul,24ul,25ul,26ul>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<140u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
::operator=(tuple_base<std::integer_sequence<unsigned_long,0ul,1ul,2ul,3ul,4ul,5ul,6ul,7ul,8ul,9ul,10ul,11ul,12ul,13ul,14ul,15ul,16ul,17ul,18ul,19ul,20ul,21ul,22ul,23ul,24ul,25ul,26ul>,Fixpp::FieldRef<Fixpp::TagT<55u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<65u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<48u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<22u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<167u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<200u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<205u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<201u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<202u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<206u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<231u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<223u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<207u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<106u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<348u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<349u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<107u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<350u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<351u,Fixpp::Type::Data>>,Fixpp::FieldRef<Fixpp::TagT<140u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<11u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<54u,Fixpp::Type::Char>>,Fixpp::FieldRef<Fixpp::TagT<44u,Fixpp::Type::Float>>,Fixpp::FieldRef<Fixpp::TagT<15u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<58u,Fixpp::Type::String>>,Fixpp::FieldRef<Fixpp::TagT<354u,Fixpp::Type::Int>>,Fixpp::FieldRef<Fixpp::TagT<355u,Fixpp::Type::Data>>>
            *this,tuple<Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<140U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
                  *v)

{
  *(char **)this =
       (v->base).
       super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 8) =
       (v->base).
       super_tuple_value<0UL,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x10) =
       (v->base).
       super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x18) =
       (v->base).
       super_tuple_value<1UL,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x20) =
       (v->base).
       super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x28) =
       (v->base).
       super_tuple_value<2UL,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x30) =
       (v->base).
       super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x38) =
       (v->base).
       super_tuple_value<3UL,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x40) =
       (v->base).
       super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x48) =
       (v->base).
       super_tuple_value<4UL,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x50) =
       (v->base).
       super_tuple_value<5UL,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x58) =
       (v->base).
       super_tuple_value<5UL,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x60) =
       (v->base).
       super_tuple_value<6UL,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x68) =
       (v->base).
       super_tuple_value<6UL,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x70) =
       (v->base).
       super_tuple_value<7UL,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x78) =
       (v->base).
       super_tuple_value<7UL,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x80) =
       (v->base).
       super_tuple_value<8UL,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x88) =
       (v->base).
       super_tuple_value<8UL,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x90) =
       (v->base).
       super_tuple_value<9UL,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x98) =
       (v->base).
       super_tuple_value<9UL,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0xa0) =
       (v->base).
       super_tuple_value<10UL,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0xa8) =
       (v->base).
       super_tuple_value<10UL,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0xb0) =
       (v->base).
       super_tuple_value<11UL,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0xb8) =
       (v->base).
       super_tuple_value<11UL,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0xc0) =
       (v->base).
       super_tuple_value<12UL,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_false>.
       value.m_view.first;
  *(unsigned_long *)(this + 200) =
       (v->base).
       super_tuple_value<12UL,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_false>.
       value.m_view.second;
  *(char **)(this + 0xd0) =
       (v->base).
       super_tuple_value<13UL,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_false>.
       value.m_view.first;
  *(unsigned_long *)(this + 0xd8) =
       (v->base).
       super_tuple_value<13UL,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_false>.
       value.m_view.second;
  *(char **)(this + 0xe0) =
       (v->base).
       super_tuple_value<14UL,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0xe8) =
       (v->base).
       super_tuple_value<14UL,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0xf0) =
       (v->base).
       super_tuple_value<15UL,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0xf8) =
       (v->base).
       super_tuple_value<15UL,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x100) =
       (v->base).
       super_tuple_value<16UL,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_false>.
       value.m_view.first;
  *(unsigned_long *)(this + 0x108) =
       (v->base).
       super_tuple_value<16UL,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_false>.
       value.m_view.second;
  *(char **)(this + 0x110) =
       (v->base).
       super_tuple_value<17UL,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x118) =
       (v->base).
       super_tuple_value<17UL,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x120) =
       (v->base).
       super_tuple_value<18UL,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x128) =
       (v->base).
       super_tuple_value<18UL,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x130) =
       (v->base).
       super_tuple_value<19UL,_Fixpp::FieldRef<Fixpp::TagT<140U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x138) =
       (v->base).
       super_tuple_value<19UL,_Fixpp::FieldRef<Fixpp::TagT<140U,_Fixpp::Type::Float>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x140) =
       (v->base).
       super_tuple_value<20UL,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x148) =
       (v->base).
       super_tuple_value<20UL,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x150) =
       (v->base).
       super_tuple_value<21UL,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x158) =
       (v->base).
       super_tuple_value<21UL,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x160) =
       (v->base).
       super_tuple_value<22UL,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x168) =
       (v->base).
       super_tuple_value<22UL,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x170) =
       (v->base).
       super_tuple_value<23UL,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x178) =
       (v->base).
       super_tuple_value<23UL,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_false>.value
       .m_view.second;
  *(char **)(this + 0x180) =
       (v->base).
       super_tuple_value<24UL,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_false>.value
       .m_view.first;
  *(unsigned_long *)(this + 0x188) =
       (v->base).
       super_tuple_value<24UL,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_false>.value
       .m_view.second;
  *(char **)(this + 400) =
       (v->base).
       super_tuple_value<25UL,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x198) =
       (v->base).
       super_tuple_value<25UL,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_false>.value.
       m_view.second;
  *(char **)(this + 0x1a0) =
       (v->base).
       super_tuple_value<26UL,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_false>.value.
       m_view.first;
  *(unsigned_long *)(this + 0x1a8) =
       (v->base).
       super_tuple_value<26UL,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>,_false>.value.
       m_view.second;
  return (tuple_base<std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL,_4UL,_5UL,_6UL,_7UL,_8UL,_9UL,_10UL,_11UL,_12UL,_13UL,_14UL,_15UL,_16UL,_17UL,_18UL,_19UL,_20UL,_21UL,_22UL,_23UL,_24UL,_25UL,_26UL>,_Fixpp::FieldRef<Fixpp::TagT<55U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<65U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<48U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<22U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<167U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<200U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<205U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<201U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<202U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<206U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<231U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<223U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<207U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<106U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<348U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<349U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<107U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<350U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<351U,_Fixpp::Type::Data>_>,_Fixpp::FieldRef<Fixpp::TagT<140U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<11U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<54U,_Fixpp::Type::Char>_>,_Fixpp::FieldRef<Fixpp::TagT<44U,_Fixpp::Type::Float>_>,_Fixpp::FieldRef<Fixpp::TagT<15U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<58U,_Fixpp::Type::String>_>,_Fixpp::FieldRef<Fixpp::TagT<354U,_Fixpp::Type::Int>_>,_Fixpp::FieldRef<Fixpp::TagT<355U,_Fixpp::Type::Data>_>_>
          *)this;
}

Assistant:

tuple_base& operator=( const tuple< Us... >& v )
        noexcept( seq::is_all< std::is_nothrow_assignable< Ts&, const Us& >::value... >::value )
      {
#ifdef FIXPP_META_FOLD_EXPRESSIONS
        ( tuple_value< Is, Ts >::operator=( get< Is >( v ) ), ... );
#else
        (void)swallow{ ( tuple_value< Is, Ts >::operator=( meta::get< Is >( v ) ), true )..., true };
#endif
        return *this;
      }